

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86.cpp
# Opt level: O0

int __thiscall ncnn::Mish_x86::forward_inplace(Mish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long *in_RSI;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar31;
  float fVar32;
  ulong uVar29;
  float fVar33;
  float fVar34;
  undefined1 auVar30 [16];
  float fVar36;
  float fVar37;
  ulong uVar35;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  __m128 two;
  __m128 one_2;
  __m128 two_1;
  __m128 one_7;
  v4sf y_1;
  v4sf z;
  v4sf tmp_1;
  v4sf mask_1;
  v4sf e;
  v4sf invalid_mask;
  v4sf one_1;
  v4si emm0_1;
  v4sf y_4;
  v4sf z_1;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_6;
  v4si emm0_4;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_5;
  v4si emm0_3;
  v4sf fx_2;
  v4sf tmp_3;
  __m128 one_8;
  v4sf pow2n_3;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_9;
  v4si emm0_5;
  v4sf fx_3;
  v4sf tmp_5;
  __m128 one_3;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_4;
  v4si emm0_2;
  v4sf fx_1;
  v4sf tmp_2;
  undefined8 local_2dc8;
  undefined8 uStack_2dc0;
  int local_2db4;
  undefined8 local_2db0;
  undefined8 local_2da8;
  undefined8 local_2da0;
  undefined4 local_2d98;
  long local_2d90;
  undefined4 local_2d88;
  undefined4 local_2d84;
  undefined4 local_2d80;
  undefined4 local_2d7c;
  undefined4 local_2d78;
  undefined8 local_2d70;
  undefined1 (*local_2d68) [16];
  int local_2d5c;
  undefined8 local_2d58;
  undefined8 uStack_2d50;
  int local_2d40;
  undefined1 (*local_2ce8) [16];
  int local_2ce0;
  int local_2cdc;
  int local_2cd8;
  int local_2cd4;
  int local_2cd0;
  int local_2ccc;
  long *local_2cc0;
  undefined1 local_2ca5;
  int local_2ca4;
  undefined8 *local_2c98;
  undefined8 *local_2c78;
  undefined8 *local_2c48;
  undefined1 (*local_2c38) [16];
  undefined8 local_2c28;
  undefined8 uStack_2c20;
  undefined8 local_2c08;
  undefined8 uStack_2c00;
  undefined1 (*local_2bf0) [16];
  long local_2b90;
  undefined4 local_2b84;
  long local_2b80;
  undefined1 (*local_2b78) [16];
  undefined4 local_2b6c;
  int local_2b68;
  int local_2b64;
  undefined8 *local_2b60;
  undefined4 local_2b54;
  long local_2b50;
  undefined8 *local_2b20;
  float local_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float local_2a88;
  float fStack_2a84;
  float fStack_2a80;
  float fStack_2a7c;
  undefined1 local_2a78 [8];
  float fStack_2a70;
  float fStack_2a6c;
  float local_2a28;
  float fStack_2a24;
  float fStack_2a20;
  float fStack_2a1c;
  float local_2a08;
  float fStack_2a04;
  float fStack_2a00;
  float fStack_29fc;
  undefined8 local_29f8;
  undefined8 uStack_29f0;
  undefined8 local_29e8;
  undefined8 uStack_29e0;
  ulong local_29d8;
  ulong uStack_29d0;
  undefined8 local_29c8;
  undefined8 uStack_29c0;
  undefined1 local_29b8 [8];
  float fStack_29b0;
  float fStack_29ac;
  undefined8 local_29a8;
  undefined8 uStack_29a0;
  undefined8 local_2998;
  undefined8 uStack_2990;
  undefined8 local_2908;
  undefined8 uStack_2900;
  undefined8 local_2898;
  undefined8 uStack_2890;
  float local_2888;
  float fStack_2884;
  float fStack_2880;
  float fStack_287c;
  ulong local_2878;
  ulong uStack_2870;
  int local_2868;
  int iStack_2864;
  int iStack_2860;
  int iStack_285c;
  float local_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  int local_2848;
  int iStack_2844;
  int iStack_2840;
  int iStack_283c;
  undefined8 local_2838;
  undefined8 uStack_2830;
  int local_2828;
  int iStack_2824;
  int iStack_2820;
  int iStack_281c;
  undefined8 local_2818;
  undefined8 uStack_2810;
  undefined8 local_2808;
  undefined8 uStack_2800;
  undefined8 local_27f8;
  undefined8 uStack_27f0;
  undefined8 local_27e8;
  undefined8 uStack_27e0;
  undefined8 local_27d8;
  undefined8 uStack_27d0;
  undefined8 local_27c8;
  undefined8 uStack_27c0;
  undefined8 local_27b8;
  undefined8 uStack_27b0;
  undefined8 local_27a8;
  undefined8 uStack_27a0;
  undefined8 local_2798;
  undefined8 uStack_2790;
  undefined8 local_2788;
  undefined8 uStack_2780;
  undefined8 local_2778;
  undefined8 uStack_2770;
  undefined8 local_2768;
  undefined8 uStack_2760;
  undefined8 local_2758;
  undefined8 uStack_2750;
  float local_2728;
  float fStack_2724;
  float fStack_2720;
  float fStack_271c;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  undefined8 local_26b8;
  undefined8 uStack_26b0;
  undefined8 local_2688;
  undefined8 uStack_2680;
  float local_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  undefined8 local_2588;
  undefined8 uStack_2580;
  undefined8 local_2578;
  undefined8 uStack_2570;
  undefined8 local_2568;
  undefined8 uStack_2560;
  undefined8 local_2558;
  undefined8 uStack_2550;
  float local_2548;
  float fStack_2544;
  float fStack_2540;
  float fStack_253c;
  float local_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  undefined8 local_2528;
  undefined8 uStack_2520;
  undefined8 local_2518;
  undefined8 uStack_2510;
  undefined8 local_2508;
  undefined8 uStack_2500;
  undefined8 local_24f8;
  undefined8 uStack_24f0;
  undefined8 local_24e8;
  undefined8 uStack_24e0;
  undefined8 local_24d8;
  undefined8 uStack_24d0;
  undefined8 local_24c8;
  undefined8 uStack_24c0;
  undefined8 local_24b8;
  undefined8 uStack_24b0;
  undefined8 local_24a8;
  undefined8 uStack_24a0;
  undefined8 local_2498;
  undefined8 uStack_2490;
  undefined8 local_2488;
  undefined8 uStack_2480;
  undefined8 local_2478;
  undefined8 uStack_2470;
  undefined4 local_2468;
  undefined4 uStack_2464;
  undefined4 uStack_2460;
  undefined4 uStack_245c;
  undefined4 local_244c;
  undefined4 local_2448;
  undefined4 uStack_2444;
  undefined4 uStack_2440;
  undefined4 uStack_243c;
  undefined4 local_242c;
  undefined4 local_23c8;
  undefined4 uStack_23c4;
  undefined4 uStack_23c0;
  undefined4 uStack_23bc;
  undefined4 local_23ac;
  undefined8 local_23a8;
  undefined8 uStack_23a0;
  undefined8 local_2398;
  undefined8 uStack_2390;
  float local_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  undefined8 local_2368;
  undefined8 uStack_2360;
  undefined8 local_2358;
  undefined8 uStack_2350;
  undefined8 local_2348;
  undefined8 uStack_2340;
  ulong local_2338;
  ulong uStack_2330;
  float local_2328;
  float fStack_2324;
  float fStack_2320;
  float fStack_231c;
  undefined8 local_22e8;
  undefined8 uStack_22e0;
  float local_22d8;
  float fStack_22d4;
  float fStack_22d0;
  float fStack_22cc;
  undefined8 local_22a8;
  undefined8 uStack_22a0;
  float local_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  undefined8 local_2288;
  undefined8 uStack_2280;
  undefined8 local_2278;
  undefined8 uStack_2270;
  undefined8 local_2268;
  undefined8 uStack_2260;
  undefined8 local_2258;
  undefined8 uStack_2250;
  undefined8 local_2248;
  undefined8 uStack_2240;
  undefined8 local_2238;
  undefined8 uStack_2230;
  float local_2228;
  float fStack_2224;
  float fStack_2220;
  float fStack_221c;
  float local_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined8 local_21a8;
  undefined8 uStack_21a0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  undefined8 local_2178;
  undefined8 uStack_2170;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined8 local_2158;
  undefined8 uStack_2150;
  undefined4 local_2148;
  undefined4 uStack_2144;
  undefined4 uStack_2140;
  undefined4 uStack_213c;
  undefined4 local_212c;
  undefined8 local_2128;
  undefined8 uStack_2120;
  undefined8 local_2118;
  undefined8 uStack_2110;
  undefined8 local_2108;
  undefined8 uStack_2100;
  undefined8 local_20f8;
  undefined8 uStack_20f0;
  undefined8 local_2088;
  undefined8 uStack_2080;
  undefined8 local_2038;
  undefined8 uStack_2030;
  float local_1fd8;
  float fStack_1fd4;
  float fStack_1fd0;
  float fStack_1fcc;
  float local_1f68;
  float fStack_1f64;
  float fStack_1f60;
  float fStack_1f5c;
  float local_1f08;
  float fStack_1f04;
  float fStack_1f00;
  float fStack_1efc;
  undefined8 local_1ef8;
  undefined8 uStack_1ef0;
  undefined8 local_1ec8;
  undefined8 uStack_1ec0;
  undefined8 local_1eb8;
  undefined8 uStack_1eb0;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  undefined8 local_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e08;
  undefined8 uStack_1e00;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined8 local_1d98;
  undefined8 uStack_1d90;
  undefined4 local_1d5c;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  uint local_1d38;
  uint uStack_1d34;
  uint uStack_1d30;
  uint uStack_1d2c;
  ulong local_1d28;
  ulong uStack_1d20;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  ulong local_1cd8;
  ulong uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  ulong local_1cb8;
  ulong uStack_1cb0;
  ulong local_1c88;
  ulong uStack_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  ulong local_1c68;
  ulong uStack_1c60;
  ulong local_1c58;
  ulong uStack_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  ulong local_1c38;
  ulong uStack_1c30;
  ulong local_1bc8;
  ulong uStack_1bc0;
  ulong local_1bb8;
  ulong uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  ulong local_1b98;
  ulong uStack_1b90;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  float local_1a78;
  float fStack_1a74;
  float fStack_1a70;
  float fStack_1a6c;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  float local_1688;
  float fStack_1684;
  float fStack_1680;
  float fStack_167c;
  undefined8 local_1678;
  undefined8 uStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 local_1648;
  undefined8 uStack_1640;
  undefined8 local_1638;
  undefined8 uStack_1630;
  undefined8 local_1628;
  undefined8 uStack_1620;
  float local_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  undefined8 local_1608;
  undefined8 uStack_1600;
  undefined8 local_15f8;
  undefined8 uStack_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 local_15b8;
  undefined8 uStack_15b0;
  float local_15a8;
  float fStack_15a4;
  float fStack_15a0;
  float fStack_159c;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  float local_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  float local_14c8;
  float fStack_14c4;
  float fStack_14c0;
  float fStack_14bc;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  undefined8 uStack_1480;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  undefined8 uStack_1460;
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  float local_13e8;
  float fStack_13e4;
  float fStack_13e0;
  float fStack_13dc;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  float local_1308;
  float fStack_1304;
  float fStack_1300;
  float fStack_12fc;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  float local_ea8;
  float fStack_ea4;
  float fStack_ea0;
  float fStack_e9c;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  float local_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  float local_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  float local_ce8;
  float fStack_ce4;
  float fStack_ce0;
  float fStack_cdc;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  float local_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 extraout_XMM0_Qb;
  
  local_2ccc = *(int *)((long)in_RSI + 0x2c);
  local_2cd0 = (int)in_RSI[6];
  local_2cd4 = (int)in_RSI[7];
  local_2cd8 = local_2ccc * local_2cd0;
  local_2cdc = (int)in_RSI[3];
  if (local_2cdc == 4) {
    for (local_2ce0 = 0; local_2ce0 < local_2cd4; local_2ce0 = local_2ce0 + 1) {
      local_2ce8 = (undefined1 (*) [16])(*in_RSI + in_RSI[8] * (long)local_2ce0 * in_RSI[2]);
      for (local_2d40 = 0; local_2d40 < local_2cd8; local_2d40 = local_2d40 + 1) {
        auVar23._8_8_ = 0x42b0c0a542b0c0a5;
        auVar23._0_8_ = 0x42b0c0a542b0c0a5;
        auVar30 = minps(*local_2ce8,auVar23);
        auVar13._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar13._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar30 = maxps(auVar30,auVar13);
        local_25d8 = auVar30._0_4_;
        fStack_25d4 = auVar30._4_4_;
        fStack_25d0 = auVar30._8_4_;
        fStack_25cc = auVar30._12_4_;
        fVar27 = local_25d8 * 1.442695 + 0.5;
        fVar31 = fStack_25d4 * 1.442695 + 0.5;
        fVar33 = fStack_25d0 * 1.442695 + 0.5;
        fVar36 = fStack_25cc * 1.442695 + 0.5;
        fVar28 = (float)(int)fVar27;
        fVar32 = (float)(int)fVar31;
        fVar34 = (float)(int)fVar33;
        fVar37 = (float)(int)fVar36;
        local_2688 = CONCAT44(-(uint)(fVar31 < fVar32),-(uint)(fVar27 < fVar28));
        uStack_2680 = CONCAT44(-(uint)(fVar36 < fVar37),-(uint)(fVar33 < fVar34));
        local_2388 = (float)(local_2688 & 0x3f8000003f800000);
        fStack_2384 = (float)((local_2688 & 0x3f8000003f800000) >> 0x20);
        fStack_2380 = (float)(uStack_2680 & 0x3f8000003f800000);
        fStack_237c = (float)((uStack_2680 & 0x3f8000003f800000) >> 0x20);
        fVar28 = fVar28 - local_2388;
        fVar32 = fVar32 - fStack_2384;
        fVar34 = fVar34 - fStack_2380;
        fVar37 = fVar37 - fStack_237c;
        fVar27 = (local_25d8 - fVar28 * 0.6933594) - fVar28 * -0.00021219444;
        fVar31 = (fStack_25d4 - fVar32 * 0.6933594) - fVar32 * -0.00021219444;
        fVar33 = (fStack_25d0 - fVar34 * 0.6933594) - fVar34 * -0.00021219444;
        fVar36 = (fStack_25cc - fVar37 * 0.6933594) - fVar37 * -0.00021219444;
        fVar27 = ((((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27 +
                    0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) * fVar27 * fVar27 + fVar27 +
                 1.0) * (float)(((int)fVar28 + 0x7f) * 0x800000) + 1.0;
        fVar28 = ((((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
                    0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) * fVar31 * fVar31 + fVar31 +
                 1.0) * (float)((int)fVar32 + 0x7f) + 1.0;
        fVar31 = ((((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
                    0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5) * fVar33 * fVar33 + fVar33 +
                 1.0) * (float)((int)fVar34 + 0x7f) + 1.0;
        fVar32 = ((((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                    0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5) * fVar36 * fVar36 + fVar36 +
                 1.0) * (float)((int)fVar37 + 0x7f) + 1.0;
        local_2908 = CONCAT44(fVar28,fVar27);
        uStack_2900._0_4_ = fVar31;
        uStack_2900._4_4_ = fVar32;
        auVar17._8_8_ = uStack_2900;
        auVar17._0_8_ = local_2908;
        auVar16._8_8_ = 0x80000000800000;
        auVar16._0_8_ = 0x80000000800000;
        auVar30 = maxps(auVar17,auVar16);
        local_2908 = auVar30._0_8_;
        uStack_2900 = auVar30._8_8_;
        local_1d38 = auVar30._0_4_;
        uStack_1d34 = auVar30._4_4_;
        uStack_1d30 = auVar30._8_4_;
        uStack_1d2c = auVar30._12_4_;
        uVar39 = local_2908 & 0x807fffff807fffff | 0x3f0000003f000000;
        uVar40 = uStack_2900 & 0x807fffff807fffff | 0x3f0000003f000000;
        local_1a78 = (float)uVar39;
        fStack_1a74 = (float)(uVar39 >> 0x20);
        fStack_1a70 = (float)uVar40;
        fStack_1a6c = (float)(uVar40 >> 0x20);
        uVar39 = uVar39 & CONCAT44(-(uint)(fStack_1a74 < 0.70710677),
                                   -(uint)(local_1a78 < 0.70710677));
        uVar40 = uVar40 & CONCAT44(-(uint)(fStack_1a6c < 0.70710677),
                                   -(uint)(fStack_1a70 < 0.70710677));
        uVar29 = CONCAT44(-(uint)(fStack_1a74 < 0.70710677),-(uint)(local_1a78 < 0.70710677)) &
                 0x3f8000003f800000;
        uVar35 = CONCAT44(-(uint)(fStack_1a6c < 0.70710677),-(uint)(fStack_1a70 < 0.70710677)) &
                 0x3f8000003f800000;
        local_2328 = (float)uVar29;
        fStack_2324 = (float)(uVar29 >> 0x20);
        fStack_2320 = (float)uVar35;
        fStack_231c = (float)(uVar35 >> 0x20);
        local_2328 = ((float)(int)((local_1d38 >> 0x17) - 0x7f) + 1.0) - local_2328;
        fStack_2324 = ((float)(int)((uStack_1d34 >> 0x17) - 0x7f) + 1.0) - fStack_2324;
        fStack_2320 = ((float)(int)((uStack_1d30 >> 0x17) - 0x7f) + 1.0) - fStack_2320;
        fStack_231c = ((float)(int)((uStack_1d2c >> 0x17) - 0x7f) + 1.0) - fStack_231c;
        local_2728 = (float)uVar39;
        fStack_2724 = (float)(uVar39 >> 0x20);
        fStack_2720 = (float)uVar40;
        fStack_271c = (float)(uVar40 >> 0x20);
        local_2728 = (local_1a78 - 1.0) + local_2728;
        fStack_2724 = (fStack_1a74 - 1.0) + fStack_2724;
        fStack_2720 = (fStack_1a70 - 1.0) + fStack_2720;
        fStack_271c = (fStack_1a6c - 1.0) + fStack_271c;
        local_2908 = CONCAT44(fStack_2324 * 0.6933594 +
                              fStack_2724 +
                              ((fStack_2324 * -0.00021219444 +
                               ((((((((fStack_2724 * 0.070376836 + -0.1151461) * fStack_2724 +
                                     0.116769984) * fStack_2724 + -0.12420141) * fStack_2724 +
                                   0.14249323) * fStack_2724 + -0.16668057) * fStack_2724 +
                                 0.20000714) * fStack_2724 + -0.24999994) * fStack_2724 + 0.3333333)
                               * fStack_2724 * fStack_2724 * fStack_2724) -
                              fStack_2724 * fStack_2724 * 0.5),
                              local_2328 * 0.6933594 +
                              local_2728 +
                              ((local_2328 * -0.00021219444 +
                               ((((((((local_2728 * 0.070376836 + -0.1151461) * local_2728 +
                                     0.116769984) * local_2728 + -0.12420141) * local_2728 +
                                   0.14249323) * local_2728 + -0.16668057) * local_2728 + 0.20000714
                                 ) * local_2728 + -0.24999994) * local_2728 + 0.3333333) *
                               local_2728 * local_2728 * local_2728) - local_2728 * local_2728 * 0.5
                              ));
        uStack_2900._0_4_ =
             fStack_2320 * 0.6933594 +
             fStack_2720 +
             ((fStack_2320 * -0.00021219444 +
              ((((((((fStack_2720 * 0.070376836 + -0.1151461) * fStack_2720 + 0.116769984) *
                    fStack_2720 + -0.12420141) * fStack_2720 + 0.14249323) * fStack_2720 +
                 -0.16668057) * fStack_2720 + 0.20000714) * fStack_2720 + -0.24999994) * fStack_2720
              + 0.3333333) * fStack_2720 * fStack_2720 * fStack_2720) -
             fStack_2720 * fStack_2720 * 0.5);
        uStack_2900._4_4_ =
             fStack_231c * 0.6933594 +
             fStack_271c +
             ((fStack_231c * -0.00021219444 +
              ((((((((fStack_271c * 0.070376836 + -0.1151461) * fStack_271c + 0.116769984) *
                    fStack_271c + -0.12420141) * fStack_271c + 0.14249323) * fStack_271c +
                 -0.16668057) * fStack_271c + 0.20000714) * fStack_271c + -0.24999994) * fStack_271c
              + 0.3333333) * fStack_271c * fStack_271c * fStack_271c) -
             fStack_271c * fStack_271c * 0.5);
        local_2908 = local_2908 | CONCAT44(-(uint)(fVar28 <= 0.0),-(uint)(fVar27 <= 0.0));
        uStack_2900 = uStack_2900 | CONCAT44(-(uint)(fVar32 <= 0.0),-(uint)(fVar31 <= 0.0));
        local_2a08 = (float)local_2908;
        fStack_2a04 = (float)(local_2908 >> 0x20);
        fStack_2a00 = (float)uStack_2900;
        fStack_29fc = (float)(uStack_2900 >> 0x20);
        local_2038 = CONCAT44(0.0 - fStack_2a04 * 2.0,0.0 - local_2a08 * 2.0);
        uStack_2030._0_4_ = 0.0 - fStack_2a00 * 2.0;
        uStack_2030._4_4_ = 0.0 - fStack_29fc * 2.0;
        auVar19._8_8_ = uStack_2030;
        auVar19._0_8_ = local_2038;
        auVar18._8_8_ = 0x42b0c0a542b0c0a5;
        auVar18._0_8_ = 0x42b0c0a542b0c0a5;
        auVar30 = minps(auVar19,auVar18);
        auVar10._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar10._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar30 = maxps(auVar30,auVar10);
        local_1fd8 = auVar30._0_4_;
        fStack_1fd4 = auVar30._4_4_;
        fStack_1fd0 = auVar30._8_4_;
        fStack_1fcc = auVar30._12_4_;
        fVar27 = local_1fd8 * 1.442695 + 0.5;
        fVar31 = fStack_1fd4 * 1.442695 + 0.5;
        fVar33 = fStack_1fd0 * 1.442695 + 0.5;
        fVar36 = fStack_1fcc * 1.442695 + 0.5;
        fVar28 = (float)(int)fVar27;
        fVar32 = (float)(int)fVar31;
        fVar34 = (float)(int)fVar33;
        fVar37 = (float)(int)fVar36;
        local_2088 = CONCAT44(-(uint)(fVar31 < fVar32),-(uint)(fVar27 < fVar28));
        uStack_2080 = CONCAT44(-(uint)(fVar36 < fVar37),-(uint)(fVar33 < fVar34));
        local_1f68 = (float)(local_2088 & 0x3f8000003f800000);
        fStack_1f64 = (float)((local_2088 & 0x3f8000003f800000) >> 0x20);
        fStack_1f60 = (float)(uStack_2080 & 0x3f8000003f800000);
        fStack_1f5c = (float)((uStack_2080 & 0x3f8000003f800000) >> 0x20);
        fVar28 = fVar28 - local_1f68;
        fVar32 = fVar32 - fStack_1f64;
        fVar34 = fVar34 - fStack_1f60;
        fVar37 = fVar37 - fStack_1f5c;
        fVar27 = (local_1fd8 - fVar28 * 0.6933594) - fVar28 * -0.00021219444;
        fVar31 = (fStack_1fd4 - fVar32 * 0.6933594) - fVar32 * -0.00021219444;
        fVar33 = (fStack_1fd0 - fVar34 * 0.6933594) - fVar34 * -0.00021219444;
        fVar36 = (fStack_1fcc - fVar37 * 0.6933594) - fVar37 * -0.00021219444;
        auVar7._8_8_ = 0x3f8000003f800000;
        auVar7._0_8_ = 0x3f8000003f800000;
        auVar6._4_4_ = ((((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31
                          + 0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) * fVar31 * fVar31 +
                        fVar31 + 1.0) * (float)((int)fVar32 + 0x7f) + 1.0;
        auVar6._0_4_ = ((((((fVar27 * 0.00019875691 + 0.0013981999) * fVar27 + 0.008333452) * fVar27
                          + 0.041665796) * fVar27 + 0.16666666) * fVar27 + 0.5) * fVar27 * fVar27 +
                        fVar27 + 1.0) * (float)(((int)fVar28 + 0x7f) * 0x800000) + 1.0;
        auVar6._8_4_ = ((((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33
                          + 0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5) * fVar33 * fVar33 +
                        fVar33 + 1.0) * (float)((int)fVar34 + 0x7f) + 1.0;
        auVar6._12_4_ =
             ((((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5) * fVar36 * fVar36 + fVar36 + 1.0
             ) * (float)((int)fVar37 + 0x7f) + 1.0;
        auVar30 = divps(auVar7,auVar6);
        local_2a28 = auVar30._0_4_;
        fStack_2a24 = auVar30._4_4_;
        fStack_2a20 = auVar30._8_4_;
        fStack_2a1c = auVar30._12_4_;
        local_2a98 = (float)*(undefined8 *)*local_2ce8;
        fStack_2a94 = (float)((ulong)*(undefined8 *)*local_2ce8 >> 0x20);
        fStack_2a90 = (float)*(undefined8 *)(*local_2ce8 + 8);
        fStack_2a8c = (float)((ulong)*(undefined8 *)(*local_2ce8 + 8) >> 0x20);
        local_2d58 = CONCAT44(fStack_2a94 * (fStack_2a24 * 2.0 - 1.0),
                              local_2a98 * (local_2a28 * 2.0 - 1.0));
        uStack_2d50 = CONCAT44(fStack_2a8c * (fStack_2a1c * 2.0 - 1.0),
                               fStack_2a90 * (fStack_2a20 * 2.0 - 1.0));
        auVar5._8_8_ = uStack_2d50;
        auVar5._0_8_ = local_2d58;
        *local_2ce8 = auVar5;
        local_2ce8 = local_2ce8 + 1;
      }
    }
  }
  else {
    local_2cc0 = in_RSI;
    for (local_2d5c = 0; local_2d5c < local_2cd4; local_2d5c = local_2d5c + 1) {
      local_2c98 = &local_2db0;
      local_2b64 = *(int *)((long)local_2cc0 + 0x2c);
      local_2b68 = (int)local_2cc0[6];
      local_2b6c = *(undefined4 *)((long)local_2cc0 + 0x34);
      local_2b78 = (undefined1 (*) [16])
                   (*local_2cc0 + local_2cc0[8] * (long)local_2d5c * local_2cc0[2]);
      local_2b80 = local_2cc0[2];
      local_2b84 = (undefined4)local_2cc0[3];
      local_2b90 = local_2cc0[4];
      local_2b60 = &local_2db0;
      local_2b50 = (long)local_2b64 * (long)local_2b68 * local_2b80;
      local_2c78 = &local_2db0;
      local_2c48 = &local_2db0;
      local_2b54 = 0x10;
      local_2ca4 = local_2d5c;
      local_2ca5 = 1;
      local_2db0 = 0;
      local_2da0 = 0;
      local_2d98 = 0;
      local_2d88 = 0;
      local_2d84 = 0;
      local_2d80 = 0;
      local_2d7c = 0;
      local_2d78 = 0;
      local_2d70 = 0;
      local_2da8 = 0;
      local_2d68 = local_2b78;
      for (local_2db4 = 0; local_2b20 = local_2c48, local_2d90 = local_2b90,
          local_2db4 + 3 < local_2cd8; local_2db4 = local_2db4 + 4) {
        local_2c38 = local_2d68;
        local_2c28 = *(undefined8 *)*local_2d68;
        uStack_2c20 = *(undefined8 *)(*local_2d68 + 8);
        auVar25 = *local_2d68;
        local_1ea8 = 0;
        uStack_1ea0 = 0;
        local_2838 = 0x3f8000003f800000;
        uStack_2830 = 0x3f8000003f800000;
        local_2a8 = 0x42b0c0a542b0c0a5;
        uStack_2a0 = 0x42b0c0a542b0c0a5;
        auVar22._8_8_ = 0x42b0c0a542b0c0a5;
        auVar22._0_8_ = 0x42b0c0a542b0c0a5;
        auVar30 = minps(*local_2d68,auVar22);
        local_2518 = auVar30._0_8_;
        local_1dd8 = local_2518;
        uStack_2510 = auVar30._8_8_;
        uStack_1dd0 = uStack_2510;
        local_1e08 = 0xc2b0c0a5c2b0c0a5;
        uStack_1e00 = 0xc2b0c0a5c2b0c0a5;
        auVar12._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar12._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar30 = maxps(auVar30,auVar12);
        local_2518 = auVar30._0_8_;
        uVar1 = local_2518;
        uStack_2510 = auVar30._8_8_;
        uVar2 = uStack_2510;
        local_24c8 = 0x3fb8aa3b3fb8aa3b;
        uStack_24c0 = 0x3fb8aa3b3fb8aa3b;
        local_24b8._0_4_ = auVar30._0_4_;
        local_24b8._4_4_ = auVar30._4_4_;
        uStack_24b0._0_4_ = auVar30._8_4_;
        uStack_24b0._4_4_ = auVar30._12_4_;
        local_2478 = CONCAT44(local_24b8._4_4_ * 1.442695,(float)local_24b8 * 1.442695);
        uStack_2470 = CONCAT44(uStack_24b0._4_4_ * 1.442695,(float)uStack_24b0 * 1.442695);
        local_2488 = 0x3f0000003f000000;
        uStack_2480 = 0x3f0000003f000000;
        fVar27 = (float)local_24b8 * 1.442695 + 0.5;
        fVar28 = local_24b8._4_4_ * 1.442695 + 0.5;
        fVar31 = (float)uStack_24b0 * 1.442695 + 0.5;
        fVar32 = uStack_24b0._4_4_ * 1.442695 + 0.5;
        local_1f8 = CONCAT44(fVar28,fVar27);
        uStack_1f0 = CONCAT44(fVar32,fVar31);
        local_1ae8 = CONCAT44((int)fVar28,(int)fVar27);
        uStack_1ae0 = CONCAT44((int)fVar32,(int)fVar31);
        local_2538 = (float)(int)fVar27;
        fStack_2534 = (float)(int)fVar28;
        fStack_2530 = (float)(int)fVar31;
        fStack_252c = (float)(int)fVar32;
        local_2528 = CONCAT44(fStack_2534,local_2538);
        uStack_2520 = CONCAT44(fStack_252c,fStack_2530);
        local_178 = local_2528;
        uStack_170 = uStack_2520;
        local_188 = CONCAT44(fVar28,fVar27);
        uStack_180 = CONCAT44(fVar32,fVar31);
        local_2568 = CONCAT44(-(uint)(fVar28 < fStack_2534),-(uint)(fVar27 < local_2538));
        uStack_2560 = CONCAT44(-(uint)(fVar32 < fStack_252c),-(uint)(fVar31 < fStack_2530));
        local_1cb8 = local_2568;
        uStack_1cb0 = uStack_2560;
        local_1cc8 = 0x3f8000003f800000;
        uStack_1cc0 = 0x3f8000003f800000;
        local_2568 = local_2568 & 0x3f8000003f800000;
        uStack_2560 = uStack_2560 & 0x3f8000003f800000;
        local_2398 = local_2528;
        uStack_2390 = uStack_2520;
        local_23a8._0_4_ = (float)local_2568;
        local_23a8._4_4_ = (float)(local_2568 >> 0x20);
        uStack_23a0._0_4_ = (float)uStack_2560;
        uStack_23a0._4_4_ = (float)(uStack_2560 >> 0x20);
        local_2538 = local_2538 - (float)local_23a8;
        fStack_2534 = fStack_2534 - local_23a8._4_4_;
        fStack_2530 = fStack_2530 - (float)uStack_23a0;
        fStack_252c = fStack_252c - uStack_23a0._4_4_;
        local_4d8 = CONCAT44(fStack_2534,local_2538);
        uStack_4d0 = CONCAT44(fStack_252c,fStack_2530);
        local_4f8 = local_2518;
        uStack_4f0 = uStack_2510;
        local_fd8 = 0x3f3180003f318000;
        uStack_fd0 = 0x3f3180003f318000;
        local_498 = local_2518;
        uStack_490 = uStack_2510;
        local_4c8 = 0x3f3180003f318000;
        uStack_4c0 = 0x3f3180003f318000;
        local_4a8 = local_2538 * 0.6933594;
        fStack_4a4 = fStack_2534 * 0.6933594;
        fStack_4a0 = fStack_2530 * 0.6933594;
        fStack_49c = fStack_252c * 0.6933594;
        local_2518 = CONCAT44(local_24b8._4_4_ - fStack_4a4,(float)local_24b8 - local_4a8);
        uStack_2510._0_4_ = (float)uStack_24b0 - fStack_4a0;
        uStack_2510._4_4_ = uStack_24b0._4_4_ - fStack_49c;
        local_548 = CONCAT44(fStack_2534,local_2538);
        uStack_540 = CONCAT44(fStack_252c,fStack_2530);
        local_568 = local_2518;
        uStack_560 = uStack_2510;
        local_f68 = 0xb95e8083b95e8083;
        uStack_f60 = 0xb95e8083b95e8083;
        local_508 = local_2518;
        uStack_500 = uStack_2510;
        local_538 = 0xb95e8083b95e8083;
        uStack_530 = 0xb95e8083b95e8083;
        local_518 = local_2538 * -0.00021219444;
        fStack_514 = fStack_2534 * -0.00021219444;
        fStack_510 = fStack_2530 * -0.00021219444;
        fStack_50c = fStack_252c * -0.00021219444;
        fVar27 = ((float)local_24b8 - local_4a8) - local_518;
        fVar28 = (local_24b8._4_4_ - fStack_4a4) - fStack_514;
        fVar31 = ((float)uStack_24b0 - fStack_4a0) - fStack_510;
        fVar32 = (uStack_24b0._4_4_ - fStack_49c) - fStack_50c;
        local_2518 = CONCAT44(fVar28,fVar27);
        uStack_2510._0_4_ = fVar31;
        uStack_2510._4_4_ = fVar32;
        local_24e8 = local_2518;
        uStack_24e0 = uStack_2510;
        local_2528 = CONCAT44(fVar28 * fVar28,fVar27 * fVar27);
        uStack_2520 = CONCAT44(fVar32 * fVar32,fVar31 * fVar31);
        local_12d8 = 0x3950696739506967;
        uStack_12d0 = 0x3950696739506967;
        local_12e8 = local_2518;
        uStack_12e0 = uStack_2510;
        local_1598 = 0x3ab743ce3ab743ce;
        uStack_1590 = 0x3ab743ce3ab743ce;
        local_12b8 = 0x3950696739506967;
        uStack_12b0 = 0x3950696739506967;
        local_12c8 = local_2518;
        uStack_12c0 = uStack_2510;
        local_1298 = fVar27 * 0.00019875691;
        fStack_1294 = fVar28 * 0.00019875691;
        fStack_1290 = fVar31 * 0.00019875691;
        fStack_128c = fVar32 * 0.00019875691;
        local_12a8 = 0x3ab743ce3ab743ce;
        uStack_12a0 = 0x3ab743ce3ab743ce;
        local_2578 = CONCAT44(fStack_1294 + 0.0013981999,local_1298 + 0.0013981999);
        uStack_2570 = CONCAT44(fStack_128c + 0.0013981999,fStack_1290 + 0.0013981999);
        local_1348 = local_2578;
        uStack_1340 = uStack_2570;
        local_1358 = local_2518;
        uStack_1350 = uStack_2510;
        local_1608 = 0x3c0889083c088908;
        uStack_1600 = 0x3c0889083c088908;
        local_1328 = local_2578;
        uStack_1320 = uStack_2570;
        local_1338 = local_2518;
        uStack_1330 = uStack_2510;
        local_1308 = (local_1298 + 0.0013981999) * fVar27;
        fStack_1304 = (fStack_1294 + 0.0013981999) * fVar28;
        fStack_1300 = (fStack_1290 + 0.0013981999) * fVar31;
        fStack_12fc = (fStack_128c + 0.0013981999) * fVar32;
        local_1318 = 0x3c0889083c088908;
        uStack_1310 = 0x3c0889083c088908;
        local_2578 = CONCAT44(fStack_1304 + 0.008333452,local_1308 + 0.008333452);
        uStack_2570 = CONCAT44(fStack_12fc + 0.008333452,fStack_1300 + 0.008333452);
        local_13b8 = local_2578;
        uStack_13b0 = uStack_2570;
        local_13c8 = local_2518;
        uStack_13c0 = uStack_2510;
        local_1678 = 0x3d2aa9c13d2aa9c1;
        uStack_1670 = 0x3d2aa9c13d2aa9c1;
        local_1398 = local_2578;
        uStack_1390 = uStack_2570;
        local_13a8 = local_2518;
        uStack_13a0 = uStack_2510;
        local_1378 = (local_1308 + 0.008333452) * fVar27;
        fStack_1374 = (fStack_1304 + 0.008333452) * fVar28;
        fStack_1370 = (fStack_1300 + 0.008333452) * fVar31;
        fStack_136c = (fStack_12fc + 0.008333452) * fVar32;
        local_1388 = 0x3d2aa9c13d2aa9c1;
        uStack_1380 = 0x3d2aa9c13d2aa9c1;
        local_2578 = CONCAT44(fStack_1374 + 0.041665796,local_1378 + 0.041665796);
        uStack_2570 = CONCAT44(fStack_136c + 0.041665796,fStack_1370 + 0.041665796);
        local_1428 = local_2578;
        uStack_1420 = uStack_2570;
        local_1438 = local_2518;
        uStack_1430 = uStack_2510;
        local_16e8 = 0x3e2aaaaa3e2aaaaa;
        uStack_16e0 = 0x3e2aaaaa3e2aaaaa;
        local_1408 = local_2578;
        uStack_1400 = uStack_2570;
        local_1418 = local_2518;
        uStack_1410 = uStack_2510;
        local_13e8 = (local_1378 + 0.041665796) * fVar27;
        fStack_13e4 = (fStack_1374 + 0.041665796) * fVar28;
        fStack_13e0 = (fStack_1370 + 0.041665796) * fVar31;
        fStack_13dc = (fStack_136c + 0.041665796) * fVar32;
        local_13f8 = 0x3e2aaaaa3e2aaaaa;
        uStack_13f0 = 0x3e2aaaaa3e2aaaaa;
        local_2578 = CONCAT44(fStack_13e4 + 0.16666666,local_13e8 + 0.16666666);
        uStack_2570 = CONCAT44(fStack_13dc + 0.16666666,fStack_13e0 + 0.16666666);
        local_1498 = local_2578;
        uStack_1490 = uStack_2570;
        local_14a8 = local_2518;
        uStack_14a0 = uStack_2510;
        local_1478 = local_2578;
        uStack_1470 = uStack_2570;
        local_1488 = local_2518;
        uStack_1480 = uStack_2510;
        local_1458 = (local_13e8 + 0.16666666) * fVar27;
        fStack_1454 = (fStack_13e4 + 0.16666666) * fVar28;
        fStack_1450 = (fStack_13e0 + 0.16666666) * fVar31;
        fStack_144c = (fStack_13dc + 0.16666666) * fVar32;
        local_1468 = 0x3f0000003f000000;
        uStack_1460 = 0x3f0000003f000000;
        local_2578 = CONCAT44(fStack_1454 + 0.5,local_1458 + 0.5);
        uStack_2570 = CONCAT44(fStack_144c + 0.5,fStack_1450 + 0.5);
        local_1508 = local_2578;
        uStack_1500 = uStack_2570;
        local_1518 = local_2528;
        uStack_1510 = uStack_2520;
        local_1528 = local_2518;
        uStack_1520 = uStack_2510;
        local_14e8 = local_2578;
        uStack_14e0 = uStack_2570;
        local_14f8 = local_2528;
        uStack_14f0 = uStack_2520;
        local_14c8 = (local_1458 + 0.5) * fVar27 * fVar27;
        fStack_14c4 = (fStack_1454 + 0.5) * fVar28 * fVar28;
        fStack_14c0 = (fStack_1450 + 0.5) * fVar31 * fVar31;
        fStack_14bc = (fStack_144c + 0.5) * fVar32 * fVar32;
        local_14d8 = local_2518;
        uStack_14d0 = uStack_2510;
        local_2578 = CONCAT44(fStack_14c4 + fVar28,local_14c8 + fVar27);
        uStack_2570 = CONCAT44(fStack_14bc + fVar32,fStack_14c0 + fVar31);
        local_2498 = local_2578;
        uStack_2490 = uStack_2570;
        local_24a8 = 0x3f8000003f800000;
        uStack_24a0 = 0x3f8000003f800000;
        fVar27 = local_14c8 + fVar27 + 1.0;
        fVar28 = fStack_14c4 + fVar28 + 1.0;
        fVar31 = fStack_14c0 + fVar31 + 1.0;
        fVar32 = fStack_14bc + fVar32 + 1.0;
        local_2578 = CONCAT44(fVar28,fVar27);
        uStack_2570 = CONCAT44(fVar32,fVar31);
        local_208 = CONCAT44(fStack_2534,local_2538);
        uStack_200 = CONCAT44(fStack_252c,fStack_2530);
        local_f8 = CONCAT44((int)fStack_2534,(int)local_2538);
        uStack_f0 = CONCAT44((int)fStack_252c,(int)fStack_2530);
        local_1b48 = 0x7f0000007f;
        uStack_1b40 = 0x7f0000007f;
        iVar38 = (int)local_2538 + 0x7f;
        fStack_2544 = (float)((int)fStack_2534 + 0x7f);
        fStack_2540 = (float)((int)fStack_2530 + 0x7f);
        fStack_253c = (float)((int)fStack_252c + 0x7f);
        local_78 = CONCAT44(fStack_2544,iVar38);
        uStack_70 = CONCAT44(fStack_253c,fStack_2540);
        local_7c = 0x17;
        local_2548 = (float)(iVar38 * 0x800000);
        local_2588 = CONCAT44(fStack_2544,local_2548);
        uStack_2580 = CONCAT44(fStack_253c,fStack_2540);
        local_24f8 = local_2578;
        uStack_24f0 = uStack_2570;
        fVar27 = fVar27 * local_2548;
        fVar28 = fVar28 * fStack_2544;
        fVar31 = fVar31 * fStack_2540;
        fVar32 = fVar32 * fStack_253c;
        local_2578 = CONCAT44(fVar28,fVar27);
        uStack_2570 = CONCAT44(fVar32,fVar31);
        local_26b8 = local_2578;
        uStack_26b0 = uStack_2570;
        local_23ac = 0x3f800000;
        local_23c8 = 0x3f800000;
        local_26c8 = 0x3f8000003f800000;
        uStack_26c0 = 0x3f8000003f800000;
        fVar27 = fVar27 + 1.0;
        fVar28 = fVar28 + 1.0;
        fVar31 = fVar31 + 1.0;
        fVar32 = fVar32 + 1.0;
        local_2818 = CONCAT44(fVar28,fVar27);
        uStack_2810._0_4_ = fVar31;
        uStack_2810._4_4_ = fVar32;
        local_1e58 = local_2818;
        uStack_1e50 = uStack_2810;
        local_1e88 = 0;
        uStack_1e80 = 0;
        local_1e68 = 0;
        uStack_1e60 = 0;
        local_2848 = -(uint)(fVar27 <= 0.0);
        iStack_2844 = -(uint)(fVar28 <= 0.0);
        iStack_2840 = -(uint)(fVar31 <= 0.0);
        iStack_283c = -(uint)(fVar32 <= 0.0);
        local_1d98 = local_2818;
        uStack_1d90 = uStack_2810;
        local_1da8 = 0x80000000800000;
        uStack_1da0 = 0x80000000800000;
        auVar15._8_8_ = uStack_2810;
        auVar15._0_8_ = local_2818;
        auVar14._8_8_ = 0x80000000800000;
        auVar14._0_8_ = 0x80000000800000;
        auVar30 = maxps(auVar15,auVar14);
        local_2818 = auVar30._0_8_;
        local_1d28 = local_2818;
        uStack_2810 = auVar30._8_8_;
        uStack_1d20 = uStack_2810;
        uVar39 = local_2818;
        uVar29 = uStack_2810;
        local_1d5c = 0x17;
        local_1d58._0_4_ = auVar30._0_4_;
        local_1d58._4_4_ = auVar30._4_4_;
        uStack_1d50._0_4_ = auVar30._8_4_;
        uStack_1d50._4_4_ = auVar30._12_4_;
        local_1c38 = local_2818;
        uStack_1c30 = uStack_2810;
        local_1c48 = 0x807fffff807fffff;
        uStack_1c40 = 0x807fffff807fffff;
        local_1b98 = local_2818 & 0x807fffff807fffff;
        uStack_1b90 = uStack_2810 & 0x807fffff807fffff;
        local_2338 = local_1b98 | 0x3f0000003f000000;
        uStack_2330 = uStack_1b90 | 0x3f0000003f000000;
        local_1b38 = CONCAT44(local_1d58._4_4_ >> 0x17,(uint)local_1d58 >> 0x17);
        uStack_1b30 = CONCAT44(uStack_1d50._4_4_ >> 0x17,(uint)uStack_1d50 >> 0x17);
        local_2828 = ((uint)local_1d58 >> 0x17) - 0x7f;
        iStack_2824 = (local_1d58._4_4_ >> 0x17) - 0x7f;
        iStack_2820 = ((uint)uStack_1d50 >> 0x17) - 0x7f;
        iStack_281c = (uStack_1d50._4_4_ >> 0x17) - 0x7f;
        local_1ac8 = CONCAT44(iStack_2824,local_2828);
        uStack_1ac0 = CONCAT44(iStack_281c,iStack_2820);
        local_2758 = CONCAT44((float)iStack_2824,(float)local_2828);
        uStack_2750 = CONCAT44((float)iStack_281c,(float)iStack_2820);
        local_2768 = 0x3f8000003f800000;
        uStack_2760 = 0x3f8000003f800000;
        local_2858 = (float)local_2828 + 1.0;
        fStack_2854 = (float)iStack_2824 + 1.0;
        fStack_2850 = (float)iStack_2820 + 1.0;
        fStack_284c = (float)iStack_281c + 1.0;
        local_1aa8 = 0x3f3504f33f3504f3;
        uStack_1aa0 = 0x3f3504f33f3504f3;
        local_1a98._0_4_ = (float)local_2338;
        local_1a98._4_4_ = (float)(local_2338 >> 0x20);
        uStack_1a90._0_4_ = (float)uStack_2330;
        uStack_1a90._4_4_ = (float)(uStack_2330 >> 0x20);
        local_2868 = -(uint)((float)local_1a98 < 0.70710677);
        iStack_2864 = -(uint)(local_1a98._4_4_ < 0.70710677);
        iStack_2860 = -(uint)((float)uStack_1a90 < 0.70710677);
        iStack_285c = -(uint)(uStack_1a90._4_4_ < 0.70710677);
        local_1c68 = CONCAT44(iStack_2864,local_2868);
        uStack_1c60 = CONCAT44(iStack_285c,iStack_2860);
        local_2878 = local_2338 & local_1c68;
        uStack_2870 = uStack_2330 & uStack_1c60;
        local_2348 = 0x3f8000003f800000;
        uStack_2340 = 0x3f8000003f800000;
        local_2818 = CONCAT44(local_1a98._4_4_ - 1.0,(float)local_1a98 - 1.0);
        uStack_2810._0_4_ = (float)uStack_1a90 - 1.0;
        uStack_2810._4_4_ = uStack_1a90._4_4_ - 1.0;
        local_2358 = CONCAT44(fStack_2854,local_2858);
        uStack_2350 = CONCAT44(fStack_284c,fStack_2850);
        local_1c78 = 0x3f8000003f800000;
        uStack_1c70 = 0x3f8000003f800000;
        local_1c88 = CONCAT44(iStack_2864,local_2868);
        uStack_1c80 = CONCAT44(iStack_285c,iStack_2860);
        uVar40 = local_1c88 & 0x3f8000003f800000;
        uVar35 = uStack_1c80 & 0x3f8000003f800000;
        local_2368._0_4_ = (float)uVar40;
        local_2368._4_4_ = (float)(uVar40 >> 0x20);
        uStack_2360._0_4_ = (float)uVar35;
        uStack_2360._4_4_ = (float)(uVar35 >> 0x20);
        local_2858 = local_2858 - (float)local_2368;
        fStack_2854 = fStack_2854 - local_2368._4_4_;
        fStack_2850 = fStack_2850 - (float)uStack_2360;
        fStack_284c = fStack_284c - uStack_2360._4_4_;
        local_2778 = local_2818;
        uStack_2770 = uStack_2810;
        local_2788._0_4_ = (float)local_2878;
        local_2788._4_4_ = (float)(local_2878 >> 0x20);
        uStack_2780._0_4_ = (float)uStack_2870;
        uStack_2780._4_4_ = (float)(uStack_2870 >> 0x20);
        local_2788._0_4_ = ((float)local_1a98 - 1.0) + (float)local_2788;
        local_2788._4_4_ = (local_1a98._4_4_ - 1.0) + local_2788._4_4_;
        uStack_2780._0_4_ = ((float)uStack_1a90 - 1.0) + (float)uStack_2780;
        uStack_2780._4_4_ = (uStack_1a90._4_4_ - 1.0) + uStack_2780._4_4_;
        local_2818 = CONCAT44(local_2788._4_4_,(float)local_2788);
        uStack_2810._0_4_ = (float)uStack_2780;
        uStack_2810._4_4_ = uStack_2780._4_4_;
        local_27c8 = local_2818;
        uStack_27c0 = uStack_2810;
        local_2888 = (float)local_2788 * (float)local_2788;
        fStack_2884 = local_2788._4_4_ * local_2788._4_4_;
        fStack_2880 = (float)uStack_2780 * (float)uStack_2780;
        fStack_287c = uStack_2780._4_4_ * uStack_2780._4_4_;
        local_bd8 = 0x3d9021bb3d9021bb;
        uStack_bd0 = 0x3d9021bb3d9021bb;
        local_be8 = local_2818;
        uStack_be0 = uStack_2810;
        local_bf8 = 0xbdebd1b8bdebd1b8;
        uStack_bf0 = 0xbdebd1b8bdebd1b8;
        local_bb8 = 0x3d9021bb3d9021bb;
        uStack_bb0 = 0x3d9021bb3d9021bb;
        local_bc8 = local_2818;
        uStack_bc0 = uStack_2810;
        local_b98 = (float)local_2788 * 0.070376836;
        fStack_b94 = local_2788._4_4_ * 0.070376836;
        fStack_b90 = (float)uStack_2780 * 0.070376836;
        fStack_b8c = uStack_2780._4_4_ * 0.070376836;
        local_ba8 = 0xbdebd1b8bdebd1b8;
        uStack_ba0 = 0xbdebd1b8bdebd1b8;
        local_2898 = CONCAT44(fStack_b94 + -0.1151461,local_b98 + -0.1151461);
        uStack_2890 = CONCAT44(fStack_b8c + -0.1151461,fStack_b90 + -0.1151461);
        local_c48 = local_2898;
        uStack_c40 = uStack_2890;
        local_c58 = local_2818;
        uStack_c50 = uStack_2810;
        local_c68 = 0x3def251a3def251a;
        uStack_c60 = 0x3def251a3def251a;
        local_c28 = local_2898;
        uStack_c20 = uStack_2890;
        local_c38 = local_2818;
        uStack_c30 = uStack_2810;
        local_c08 = (local_b98 + -0.1151461) * (float)local_2788;
        fStack_c04 = (fStack_b94 + -0.1151461) * local_2788._4_4_;
        fStack_c00 = (fStack_b90 + -0.1151461) * (float)uStack_2780;
        fStack_bfc = (fStack_b8c + -0.1151461) * uStack_2780._4_4_;
        local_c18 = 0x3def251a3def251a;
        uStack_c10 = 0x3def251a3def251a;
        local_2898 = CONCAT44(fStack_c04 + 0.116769984,local_c08 + 0.116769984);
        uStack_2890 = CONCAT44(fStack_bfc + 0.116769984,fStack_c00 + 0.116769984);
        local_cb8 = local_2898;
        uStack_cb0 = uStack_2890;
        local_cc8 = local_2818;
        uStack_cc0 = uStack_2810;
        local_cd8 = 0xbdfe5d4fbdfe5d4f;
        uStack_cd0 = 0xbdfe5d4fbdfe5d4f;
        local_c98 = local_2898;
        uStack_c90 = uStack_2890;
        local_ca8 = local_2818;
        uStack_ca0 = uStack_2810;
        local_c78 = (local_c08 + 0.116769984) * (float)local_2788;
        fStack_c74 = (fStack_c04 + 0.116769984) * local_2788._4_4_;
        fStack_c70 = (fStack_c00 + 0.116769984) * (float)uStack_2780;
        fStack_c6c = (fStack_bfc + 0.116769984) * uStack_2780._4_4_;
        local_c88 = 0xbdfe5d4fbdfe5d4f;
        uStack_c80 = 0xbdfe5d4fbdfe5d4f;
        local_2898 = CONCAT44(fStack_c74 + -0.12420141,local_c78 + -0.12420141);
        uStack_2890 = CONCAT44(fStack_c6c + -0.12420141,fStack_c70 + -0.12420141);
        local_d28 = local_2898;
        uStack_d20 = uStack_2890;
        local_d38 = local_2818;
        uStack_d30 = uStack_2810;
        local_d48 = 0x3e11e9bf3e11e9bf;
        uStack_d40 = 0x3e11e9bf3e11e9bf;
        local_d08 = local_2898;
        uStack_d00 = uStack_2890;
        local_d18 = local_2818;
        uStack_d10 = uStack_2810;
        local_ce8 = (local_c78 + -0.12420141) * (float)local_2788;
        fStack_ce4 = (fStack_c74 + -0.12420141) * local_2788._4_4_;
        fStack_ce0 = (fStack_c70 + -0.12420141) * (float)uStack_2780;
        fStack_cdc = (fStack_c6c + -0.12420141) * uStack_2780._4_4_;
        local_cf8 = 0x3e11e9bf3e11e9bf;
        uStack_cf0 = 0x3e11e9bf3e11e9bf;
        local_2898 = CONCAT44(fStack_ce4 + 0.14249323,local_ce8 + 0.14249323);
        uStack_2890 = CONCAT44(fStack_cdc + 0.14249323,fStack_ce0 + 0.14249323);
        local_d98 = local_2898;
        uStack_d90 = uStack_2890;
        local_da8 = local_2818;
        uStack_da0 = uStack_2810;
        local_db8 = 0xbe2aae50be2aae50;
        uStack_db0 = 0xbe2aae50be2aae50;
        local_d78 = local_2898;
        uStack_d70 = uStack_2890;
        local_d88 = local_2818;
        uStack_d80 = uStack_2810;
        local_d58 = (local_ce8 + 0.14249323) * (float)local_2788;
        fStack_d54 = (fStack_ce4 + 0.14249323) * local_2788._4_4_;
        fStack_d50 = (fStack_ce0 + 0.14249323) * (float)uStack_2780;
        fStack_d4c = (fStack_cdc + 0.14249323) * uStack_2780._4_4_;
        local_d68 = 0xbe2aae50be2aae50;
        uStack_d60 = 0xbe2aae50be2aae50;
        local_2898 = CONCAT44(fStack_d54 + -0.16668057,local_d58 + -0.16668057);
        uStack_2890 = CONCAT44(fStack_d4c + -0.16668057,fStack_d50 + -0.16668057);
        local_e08 = local_2898;
        uStack_e00 = uStack_2890;
        local_e18 = local_2818;
        uStack_e10 = uStack_2810;
        local_e28 = 0x3e4cceac3e4cceac;
        uStack_e20 = 0x3e4cceac3e4cceac;
        local_de8 = local_2898;
        uStack_de0 = uStack_2890;
        local_df8 = local_2818;
        uStack_df0 = uStack_2810;
        local_dc8 = (local_d58 + -0.16668057) * (float)local_2788;
        fStack_dc4 = (fStack_d54 + -0.16668057) * local_2788._4_4_;
        fStack_dc0 = (fStack_d50 + -0.16668057) * (float)uStack_2780;
        fStack_dbc = (fStack_d4c + -0.16668057) * uStack_2780._4_4_;
        local_dd8 = 0x3e4cceac3e4cceac;
        uStack_dd0 = 0x3e4cceac3e4cceac;
        local_2898 = CONCAT44(fStack_dc4 + 0.20000714,local_dc8 + 0.20000714);
        uStack_2890 = CONCAT44(fStack_dbc + 0.20000714,fStack_dc0 + 0.20000714);
        local_e78 = local_2898;
        uStack_e70 = uStack_2890;
        local_e88 = local_2818;
        uStack_e80 = uStack_2810;
        local_e98 = 0xbe7ffffcbe7ffffc;
        uStack_e90 = 0xbe7ffffcbe7ffffc;
        local_e58 = local_2898;
        uStack_e50 = uStack_2890;
        local_e68 = local_2818;
        uStack_e60 = uStack_2810;
        local_e38 = (local_dc8 + 0.20000714) * (float)local_2788;
        fStack_e34 = (fStack_dc4 + 0.20000714) * local_2788._4_4_;
        fStack_e30 = (fStack_dc0 + 0.20000714) * (float)uStack_2780;
        fStack_e2c = (fStack_dbc + 0.20000714) * uStack_2780._4_4_;
        local_e48 = 0xbe7ffffcbe7ffffc;
        uStack_e40 = 0xbe7ffffcbe7ffffc;
        local_2898 = CONCAT44(fStack_e34 + -0.24999994,local_e38 + -0.24999994);
        uStack_2890 = CONCAT44(fStack_e2c + -0.24999994,fStack_e30 + -0.24999994);
        local_ee8 = local_2898;
        uStack_ee0 = uStack_2890;
        local_ef8 = local_2818;
        uStack_ef0 = uStack_2810;
        local_f08 = 0x3eaaaaaa3eaaaaaa;
        uStack_f00 = 0x3eaaaaaa3eaaaaaa;
        local_ec8 = local_2898;
        uStack_ec0 = uStack_2890;
        local_ed8 = local_2818;
        uStack_ed0 = uStack_2810;
        local_ea8 = (local_e38 + -0.24999994) * (float)local_2788;
        fStack_ea4 = (fStack_e34 + -0.24999994) * local_2788._4_4_;
        fStack_ea0 = (fStack_e30 + -0.24999994) * (float)uStack_2780;
        fStack_e9c = (fStack_e2c + -0.24999994) * uStack_2780._4_4_;
        local_eb8 = 0x3eaaaaaa3eaaaaaa;
        uStack_eb0 = 0x3eaaaaaa3eaaaaaa;
        local_2898 = CONCAT44(fStack_ea4 + 0.3333333,local_ea8 + 0.3333333);
        uStack_2890 = CONCAT44(fStack_e9c + 0.3333333,fStack_ea0 + 0.3333333);
        local_27d8 = local_2898;
        uStack_27d0 = uStack_2890;
        local_27e8 = local_2818;
        uStack_27e0 = uStack_2810;
        fVar27 = (local_ea8 + 0.3333333) * (float)local_2788;
        fVar28 = (fStack_ea4 + 0.3333333) * local_2788._4_4_;
        fVar31 = (fStack_ea0 + 0.3333333) * (float)uStack_2780;
        fVar32 = (fStack_e9c + 0.3333333) * uStack_2780._4_4_;
        local_2898 = CONCAT44(fVar28,fVar27);
        uStack_2890 = CONCAT44(fVar32,fVar31);
        local_27f8 = local_2898;
        uStack_27f0 = uStack_2890;
        local_2808 = CONCAT44(fStack_2884,local_2888);
        uStack_2800 = CONCAT44(fStack_287c,fStack_2880);
        fVar27 = fVar27 * local_2888;
        fVar28 = fVar28 * fStack_2884;
        fVar31 = fVar31 * fStack_2880;
        fVar32 = fVar32 * fStack_287c;
        local_2898 = CONCAT44(fVar28,fVar27);
        uStack_2890 = CONCAT44(fVar32,fVar31);
        local_f58 = CONCAT44(fStack_2854,local_2858);
        uStack_f50 = CONCAT44(fStack_284c,fStack_2850);
        local_f78 = local_2898;
        uStack_f70 = uStack_2890;
        local_f48 = 0xb95e8083b95e8083;
        uStack_f40 = 0xb95e8083b95e8083;
        local_f18 = local_2858 * -0.00021219444;
        fStack_f14 = fStack_2854 * -0.00021219444;
        fStack_f10 = fStack_2850 * -0.00021219444;
        fStack_f0c = fStack_284c * -0.00021219444;
        local_f28 = local_2898;
        uStack_f20 = uStack_2890;
        fVar27 = local_f18 + fVar27;
        fVar28 = fStack_f14 + fVar28;
        fVar31 = fStack_f10 + fVar31;
        fVar32 = fStack_f0c + fVar32;
        local_2898 = CONCAT44(fVar28,fVar27);
        uStack_2890 = CONCAT44(fVar32,fVar31);
        local_388 = CONCAT44(fStack_2884,local_2888);
        uStack_380 = CONCAT44(fStack_287c,fStack_2880);
        local_3a8 = local_2898;
        uStack_3a0 = uStack_2890;
        local_348 = local_2898;
        uStack_340 = uStack_2890;
        local_378 = 0x3f0000003f000000;
        uStack_370 = 0x3f0000003f000000;
        local_358 = local_2888 * 0.5;
        fStack_354 = fStack_2884 * 0.5;
        fStack_350 = fStack_2880 * 0.5;
        fStack_34c = fStack_287c * 0.5;
        fVar27 = fVar27 - local_358;
        fVar28 = fVar28 - fStack_354;
        fVar31 = fVar31 - fStack_350;
        fVar32 = fVar32 - fStack_34c;
        local_2898 = CONCAT44(fVar28,fVar27);
        uStack_2890 = CONCAT44(fVar32,fVar31);
        local_2798 = local_2818;
        uStack_2790 = uStack_2810;
        local_27a8 = local_2898;
        uStack_27a0 = uStack_2890;
        local_2788._0_4_ = (float)local_2788 + fVar27;
        local_2788._4_4_ = local_2788._4_4_ + fVar28;
        uStack_2780._0_4_ = (float)uStack_2780 + fVar31;
        uStack_2780._4_4_ = uStack_2780._4_4_ + fVar32;
        local_2818 = CONCAT44(local_2788._4_4_,(float)local_2788);
        uStack_2810._0_4_ = (float)uStack_2780;
        uStack_2810._4_4_ = uStack_2780._4_4_;
        local_fc8 = CONCAT44(fStack_2854,local_2858);
        uStack_fc0 = CONCAT44(fStack_284c,fStack_2850);
        local_fe8 = local_2818;
        uStack_fe0 = uStack_2810;
        local_fb8 = 0x3f3180003f318000;
        uStack_fb0 = 0x3f3180003f318000;
        local_f88 = local_2858 * 0.6933594;
        fStack_f84 = fStack_2854 * 0.6933594;
        fStack_f80 = fStack_2850 * 0.6933594;
        fStack_f7c = fStack_284c * 0.6933594;
        local_f98 = local_2818;
        uStack_f90 = uStack_2810;
        local_2818 = CONCAT44(fStack_f84 + local_2788._4_4_,local_f88 + (float)local_2788);
        uStack_2810._0_4_ = fStack_f80 + (float)uStack_2780;
        uStack_2810._4_4_ = fStack_f7c + uStack_2780._4_4_;
        local_1bb8 = local_2818;
        uStack_1bb0 = uStack_2810;
        local_1bc8 = CONCAT44(iStack_2844,local_2848);
        uStack_1bc0 = CONCAT44(iStack_283c,iStack_2840);
        local_29d8 = local_2818 | local_1bc8;
        uStack_29d0 = uStack_2810 | uStack_1bc0;
        uStack_2810 = uStack_29d0;
        local_2818 = local_29d8;
        local_242c = 0x3f800000;
        local_2448 = 0x3f800000;
        local_29e8 = 0x3f8000003f800000;
        uStack_29e0 = 0x3f8000003f800000;
        local_244c = 0x40000000;
        local_2468 = 0x40000000;
        local_29f8 = 0x4000000040000000;
        uStack_29f0 = 0x4000000040000000;
        local_2998._0_4_ = (float)local_29d8;
        local_2998._4_4_ = (float)(local_29d8 >> 0x20);
        uStack_2990._0_4_ = (float)uStack_29d0;
        uStack_2990._4_4_ = (float)(uStack_29d0 >> 0x20);
        local_2298 = (float)local_2998 * 2.0;
        fStack_2294 = local_2998._4_4_ * 2.0;
        fStack_2290 = (float)uStack_2990 * 2.0;
        fStack_228c = uStack_2990._4_4_ * 2.0;
        local_212c = 0x3f800000;
        local_2148 = 0x3f800000;
        local_22a8 = 0x3f8000003f800000;
        uStack_22a0 = 0x3f8000003f800000;
        local_1eb8 = 0;
        uStack_1eb0 = 0;
        local_20f8 = 0;
        uStack_20f0 = 0;
        local_2108 = CONCAT44(fStack_2294,local_2298);
        uStack_2100 = CONCAT44(fStack_228c,fStack_2290);
        local_21f8 = CONCAT44(0.0 - fStack_2294,0.0 - local_2298);
        uStack_21f0._0_4_ = 0.0 - fStack_2290;
        uStack_21f0._4_4_ = 0.0 - fStack_228c;
        local_1ec8 = 0;
        uStack_1ec0 = 0;
        local_128 = 0x7f0000007f;
        uStack_120 = 0x7f0000007f;
        local_298 = local_21f8;
        uStack_290 = uStack_21f0;
        auVar21._8_8_ = uStack_21f0;
        auVar21._0_8_ = local_21f8;
        auVar20._8_8_ = 0x42b0c0a542b0c0a5;
        auVar20._0_8_ = 0x42b0c0a542b0c0a5;
        auVar30 = minps(auVar21,auVar20);
        local_21f8 = auVar30._0_8_;
        local_1df8 = local_21f8;
        uStack_21f0 = auVar30._8_8_;
        uStack_1df0 = uStack_21f0;
        auVar11._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar11._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar30 = maxps(auVar30,auVar11);
        local_21f8 = auVar30._0_8_;
        uVar3 = local_21f8;
        uStack_21f0 = auVar30._8_8_;
        uVar4 = uStack_21f0;
        local_2198._0_4_ = auVar30._0_4_;
        local_2198._4_4_ = auVar30._4_4_;
        uStack_2190._0_4_ = auVar30._8_4_;
        uStack_2190._4_4_ = auVar30._12_4_;
        local_2158 = CONCAT44(local_2198._4_4_ * 1.442695,(float)local_2198 * 1.442695);
        uStack_2150 = CONCAT44(uStack_2190._4_4_ * 1.442695,(float)uStack_2190 * 1.442695);
        fVar27 = (float)local_2198 * 1.442695 + 0.5;
        fVar28 = local_2198._4_4_ * 1.442695 + 0.5;
        fVar31 = (float)uStack_2190 * 1.442695 + 0.5;
        fVar32 = uStack_2190._4_4_ * 1.442695 + 0.5;
        local_218 = CONCAT44(fVar28,fVar27);
        uStack_210 = CONCAT44(fVar32,fVar31);
        local_1af8 = CONCAT44((int)fVar28,(int)fVar27);
        uStack_1af0 = CONCAT44((int)fVar32,(int)fVar31);
        local_2218 = (float)(int)fVar27;
        fStack_2214 = (float)(int)fVar28;
        fStack_2210 = (float)(int)fVar31;
        fStack_220c = (float)(int)fVar32;
        local_2208 = CONCAT44(fStack_2214,local_2218);
        uStack_2200 = CONCAT44(fStack_220c,fStack_2210);
        local_198 = local_2208;
        uStack_190 = uStack_2200;
        local_1a8 = CONCAT44(fVar28,fVar27);
        uStack_1a0 = CONCAT44(fVar32,fVar31);
        local_2248 = CONCAT44(-(uint)(fVar28 < fStack_2214),-(uint)(fVar27 < local_2218));
        uStack_2240 = CONCAT44(-(uint)(fVar32 < fStack_220c),-(uint)(fVar31 < fStack_2210));
        local_1cd8 = local_2248;
        uStack_1cd0 = uStack_2240;
        local_1ce8 = 0x3f8000003f800000;
        uStack_1ce0 = 0x3f8000003f800000;
        local_2248 = local_2248 & 0x3f8000003f800000;
        uStack_2240 = uStack_2240 & 0x3f8000003f800000;
        local_2118 = local_2208;
        uStack_2110 = uStack_2200;
        local_2128._0_4_ = (float)local_2248;
        local_2128._4_4_ = (float)(local_2248 >> 0x20);
        uStack_2120._0_4_ = (float)uStack_2240;
        uStack_2120._4_4_ = (float)(uStack_2240 >> 0x20);
        local_2218 = local_2218 - (float)local_2128;
        fStack_2214 = fStack_2214 - local_2128._4_4_;
        fStack_2210 = fStack_2210 - (float)uStack_2120;
        fStack_220c = fStack_220c - uStack_2120._4_4_;
        local_5b8 = CONCAT44(fStack_2214,local_2218);
        uStack_5b0 = CONCAT44(fStack_220c,fStack_2210);
        local_5d8 = local_21f8;
        uStack_5d0 = uStack_21f0;
        local_578 = local_21f8;
        uStack_570 = uStack_21f0;
        local_5a8 = 0x3f3180003f318000;
        uStack_5a0 = 0x3f3180003f318000;
        local_588 = local_2218 * 0.6933594;
        fStack_584 = fStack_2214 * 0.6933594;
        fStack_580 = fStack_2210 * 0.6933594;
        fStack_57c = fStack_220c * 0.6933594;
        local_21f8 = CONCAT44(local_2198._4_4_ - fStack_584,(float)local_2198 - local_588);
        uStack_21f0._0_4_ = (float)uStack_2190 - fStack_580;
        uStack_21f0._4_4_ = uStack_2190._4_4_ - fStack_57c;
        local_628 = CONCAT44(fStack_2214,local_2218);
        uStack_620 = CONCAT44(fStack_220c,fStack_2210);
        local_648 = local_21f8;
        uStack_640 = uStack_21f0;
        local_5e8 = local_21f8;
        uStack_5e0 = uStack_21f0;
        local_618 = 0xb95e8083b95e8083;
        uStack_610 = 0xb95e8083b95e8083;
        local_5f8 = local_2218 * -0.00021219444;
        fStack_5f4 = fStack_2214 * -0.00021219444;
        fStack_5f0 = fStack_2210 * -0.00021219444;
        fStack_5ec = fStack_220c * -0.00021219444;
        fVar27 = ((float)local_2198 - local_588) - local_5f8;
        fVar28 = (local_2198._4_4_ - fStack_584) - fStack_5f4;
        fVar31 = ((float)uStack_2190 - fStack_580) - fStack_5f0;
        fVar32 = (uStack_2190._4_4_ - fStack_57c) - fStack_5ec;
        local_21f8 = CONCAT44(fVar28,fVar27);
        uStack_21f0._0_4_ = fVar31;
        uStack_21f0._4_4_ = fVar32;
        local_21c8 = local_21f8;
        uStack_21c0 = uStack_21f0;
        local_2208 = CONCAT44(fVar28 * fVar28,fVar27 * fVar27);
        uStack_2200 = CONCAT44(fVar32 * fVar32,fVar31 * fVar31);
        local_1578 = 0x3950696739506967;
        uStack_1570 = 0x3950696739506967;
        local_1588 = local_21f8;
        uStack_1580 = uStack_21f0;
        local_1558 = 0x3950696739506967;
        uStack_1550 = 0x3950696739506967;
        local_1568 = local_21f8;
        uStack_1560 = uStack_21f0;
        local_1538 = fVar27 * 0.00019875691;
        fStack_1534 = fVar28 * 0.00019875691;
        fStack_1530 = fVar31 * 0.00019875691;
        fStack_152c = fVar32 * 0.00019875691;
        local_1548 = 0x3ab743ce3ab743ce;
        uStack_1540 = 0x3ab743ce3ab743ce;
        local_2258 = CONCAT44(fStack_1534 + 0.0013981999,local_1538 + 0.0013981999);
        uStack_2250 = CONCAT44(fStack_152c + 0.0013981999,fStack_1530 + 0.0013981999);
        local_15e8 = local_2258;
        uStack_15e0 = uStack_2250;
        local_15f8 = local_21f8;
        uStack_15f0 = uStack_21f0;
        local_15c8 = local_2258;
        uStack_15c0 = uStack_2250;
        local_15d8 = local_21f8;
        uStack_15d0 = uStack_21f0;
        local_15a8 = (local_1538 + 0.0013981999) * fVar27;
        fStack_15a4 = (fStack_1534 + 0.0013981999) * fVar28;
        fStack_15a0 = (fStack_1530 + 0.0013981999) * fVar31;
        fStack_159c = (fStack_152c + 0.0013981999) * fVar32;
        local_15b8 = 0x3c0889083c088908;
        uStack_15b0 = 0x3c0889083c088908;
        local_2258 = CONCAT44(fStack_15a4 + 0.008333452,local_15a8 + 0.008333452);
        uStack_2250 = CONCAT44(fStack_159c + 0.008333452,fStack_15a0 + 0.008333452);
        local_1658 = local_2258;
        uStack_1650 = uStack_2250;
        local_1668 = local_21f8;
        uStack_1660 = uStack_21f0;
        local_1638 = local_2258;
        uStack_1630 = uStack_2250;
        local_1648 = local_21f8;
        uStack_1640 = uStack_21f0;
        local_1618 = (local_15a8 + 0.008333452) * fVar27;
        fStack_1614 = (fStack_15a4 + 0.008333452) * fVar28;
        fStack_1610 = (fStack_15a0 + 0.008333452) * fVar31;
        fStack_160c = (fStack_159c + 0.008333452) * fVar32;
        local_1628 = 0x3d2aa9c13d2aa9c1;
        uStack_1620 = 0x3d2aa9c13d2aa9c1;
        local_2258 = CONCAT44(fStack_1614 + 0.041665796,local_1618 + 0.041665796);
        uStack_2250 = CONCAT44(fStack_160c + 0.041665796,fStack_1610 + 0.041665796);
        local_16c8 = local_2258;
        uStack_16c0 = uStack_2250;
        local_16d8 = local_21f8;
        uStack_16d0 = uStack_21f0;
        local_16a8 = local_2258;
        uStack_16a0 = uStack_2250;
        local_16b8 = local_21f8;
        uStack_16b0 = uStack_21f0;
        local_1688 = (local_1618 + 0.041665796) * fVar27;
        fStack_1684 = (fStack_1614 + 0.041665796) * fVar28;
        fStack_1680 = (fStack_1610 + 0.041665796) * fVar31;
        fStack_167c = (fStack_160c + 0.041665796) * fVar32;
        local_1698 = 0x3e2aaaaa3e2aaaaa;
        uStack_1690 = 0x3e2aaaaa3e2aaaaa;
        local_2258 = CONCAT44(fStack_1684 + 0.16666666,local_1688 + 0.16666666);
        uStack_2250 = CONCAT44(fStack_167c + 0.16666666,fStack_1680 + 0.16666666);
        local_1738 = local_2258;
        uStack_1730 = uStack_2250;
        local_1748 = local_21f8;
        uStack_1740 = uStack_21f0;
        local_1718 = local_2258;
        uStack_1710 = uStack_2250;
        local_1728 = local_21f8;
        uStack_1720 = uStack_21f0;
        local_16f8 = (local_1688 + 0.16666666) * fVar27;
        fStack_16f4 = (fStack_1684 + 0.16666666) * fVar28;
        fStack_16f0 = (fStack_1680 + 0.16666666) * fVar31;
        fStack_16ec = (fStack_167c + 0.16666666) * fVar32;
        local_1708 = 0x3f0000003f000000;
        uStack_1700 = 0x3f0000003f000000;
        local_2258 = CONCAT44(fStack_16f4 + 0.5,local_16f8 + 0.5);
        uStack_2250 = CONCAT44(fStack_16ec + 0.5,fStack_16f0 + 0.5);
        local_17a8 = local_2258;
        uStack_17a0 = uStack_2250;
        local_17b8 = local_2208;
        uStack_17b0 = uStack_2200;
        local_17c8 = local_21f8;
        uStack_17c0 = uStack_21f0;
        local_1788 = local_2258;
        uStack_1780 = uStack_2250;
        local_1798 = local_2208;
        uStack_1790 = uStack_2200;
        local_1768 = (local_16f8 + 0.5) * fVar27 * fVar27;
        fStack_1764 = (fStack_16f4 + 0.5) * fVar28 * fVar28;
        fStack_1760 = (fStack_16f0 + 0.5) * fVar31 * fVar31;
        fStack_175c = (fStack_16ec + 0.5) * fVar32 * fVar32;
        local_1778 = local_21f8;
        uStack_1770 = uStack_21f0;
        local_2258 = CONCAT44(fStack_1764 + fVar28,local_1768 + fVar27);
        uStack_2250 = CONCAT44(fStack_175c + fVar32,fStack_1760 + fVar31);
        local_2178 = local_2258;
        uStack_2170 = uStack_2250;
        local_2188 = 0x3f8000003f800000;
        uStack_2180 = 0x3f8000003f800000;
        local_1f08 = local_1768 + fVar27 + 1.0;
        fStack_1f04 = fStack_1764 + fVar28 + 1.0;
        fStack_1f00 = fStack_1760 + fVar31 + 1.0;
        fStack_1efc = fStack_175c + fVar32 + 1.0;
        local_2258 = CONCAT44(fStack_1f04,local_1f08);
        uStack_2250 = CONCAT44(fStack_1efc,fStack_1f00);
        local_228 = CONCAT44(fStack_2214,local_2218);
        uStack_220 = CONCAT44(fStack_220c,fStack_2210);
        local_118 = CONCAT44((int)fStack_2214,(int)local_2218);
        uStack_110 = CONCAT44((int)fStack_220c,(int)fStack_2210);
        iVar38 = (int)local_2218 + 0x7f;
        fStack_2224 = (float)((int)fStack_2214 + 0x7f);
        fStack_2220 = (float)((int)fStack_2210 + 0x7f);
        fStack_221c = (float)((int)fStack_220c + 0x7f);
        local_98 = CONCAT44(fStack_2224,iVar38);
        uStack_90 = CONCAT44(fStack_221c,fStack_2220);
        local_9c = 0x17;
        local_2228 = (float)(iVar38 * 0x800000);
        local_2268 = CONCAT44(fStack_2224,local_2228);
        uStack_2260 = CONCAT44(fStack_221c,fStack_2220);
        local_21d8 = local_2258;
        uStack_21d0 = uStack_2250;
        local_1f08 = local_1f08 * local_2228;
        fStack_1f04 = fStack_1f04 * fStack_2224;
        fStack_1f00 = fStack_1f00 * fStack_2220;
        fStack_1efc = fStack_1efc * fStack_221c;
        local_2258 = CONCAT44(fStack_1f04,local_1f08);
        uStack_2250 = CONCAT44(fStack_1efc,fStack_1f00);
        local_2288 = local_2258;
        uStack_2280 = uStack_2250;
        local_1f08 = local_1f08 + 1.0;
        fStack_1f04 = fStack_1f04 + 1.0;
        fStack_1f00 = fStack_1f00 + 1.0;
        fStack_1efc = fStack_1efc + 1.0;
        auVar9._8_8_ = 0x3f8000003f800000;
        auVar9._0_8_ = 0x3f8000003f800000;
        auVar8._4_4_ = fStack_1f04;
        auVar8._0_4_ = local_1f08;
        auVar8._8_4_ = fStack_1f00;
        auVar8._12_4_ = fStack_1efc;
        _local_29b8 = divps(auVar9,auVar8);
        local_22d8 = (float)local_29b8._0_4_ * 2.0;
        fStack_22d4 = (float)local_29b8._4_4_ * 2.0;
        fStack_22d0 = fStack_29b0 * 2.0;
        fStack_22cc = fStack_29ac * 2.0;
        local_2a88 = local_22d8 - 1.0;
        fStack_2a84 = fStack_22d4 - 1.0;
        fStack_2a80 = fStack_22d0 - 1.0;
        fStack_2a7c = fStack_22cc - 1.0;
        local_2a78._0_4_ = (undefined4)local_2c28;
        local_2a78._4_4_ = (undefined4)((ulong)local_2c28 >> 0x20);
        fStack_2a70 = (float)uStack_2c20;
        fStack_2a6c = (float)((ulong)uStack_2c20 >> 0x20);
        local_2dc8 = CONCAT44((float)local_2a78._4_4_ * fStack_2a84,
                              (float)local_2a78._0_4_ * local_2a88);
        uStack_2dc0 = CONCAT44(fStack_2a6c * fStack_2a7c,fStack_2a70 * fStack_2a80);
        local_2bf0 = local_2d68;
        local_2c08 = local_2dc8;
        uStack_2c00 = uStack_2dc0;
        auVar30._8_8_ = uStack_2dc0;
        auVar30._0_8_ = local_2dc8;
        *local_2d68 = auVar30;
        local_2d68 = local_2d68 + 1;
        _local_2a78 = auVar25;
        local_29c8 = local_29f8;
        uStack_29c0 = uStack_29f0;
        local_29a8 = local_29f8;
        uStack_29a0 = uStack_29f0;
        local_2998 = local_29d8;
        uStack_2990 = uStack_29d0;
        local_27b8 = local_27c8;
        uStack_27b0 = uStack_27c0;
        local_2788 = local_2878;
        uStack_2780 = uStack_2870;
        local_2558 = local_2838;
        uStack_2550 = uStack_2830;
        local_2508 = local_2588;
        uStack_2500 = uStack_2580;
        local_24d8 = local_24e8;
        uStack_24d0 = uStack_24e0;
        local_24b8 = uVar1;
        uStack_24b0 = uVar2;
        uStack_2464 = local_2468;
        uStack_2460 = local_2468;
        uStack_245c = local_2468;
        uStack_2444 = local_2448;
        uStack_2440 = local_2448;
        uStack_243c = local_2448;
        uStack_23c4 = local_23c8;
        uStack_23c0 = local_23c8;
        uStack_23bc = local_23c8;
        local_23a8 = local_2568;
        uStack_23a0 = uStack_2560;
        local_2368 = uVar40;
        uStack_2360 = uVar35;
        local_22e8 = local_29e8;
        uStack_22e0 = uStack_29e0;
        local_2278 = local_22a8;
        uStack_2270 = uStack_22a0;
        local_2238 = local_2838;
        uStack_2230 = uStack_2830;
        local_21e8 = local_2268;
        uStack_21e0 = uStack_2260;
        local_21b8 = local_21c8;
        uStack_21b0 = uStack_21c0;
        local_21a8 = local_24c8;
        uStack_21a0 = uStack_24c0;
        local_2198 = uVar3;
        uStack_2190 = uVar4;
        local_2168 = local_2488;
        uStack_2160 = uStack_2480;
        uStack_2144 = local_2148;
        uStack_2140 = local_2148;
        uStack_213c = local_2148;
        local_2128 = local_2248;
        uStack_2120 = uStack_2240;
        local_1ef8 = local_22a8;
        uStack_1ef0 = uStack_22a0;
        local_1de8 = local_1e08;
        uStack_1de0 = uStack_1e00;
        local_1d58 = uVar39;
        uStack_1d50 = uVar29;
        local_1c58 = local_2338;
        uStack_1c50 = uStack_2330;
        local_1ba8 = local_2488;
        uStack_1ba0 = uStack_2480;
        local_1a98 = local_2338;
        uStack_1a90 = uStack_2330;
        local_1758 = local_2488;
        uStack_1750 = uStack_2480;
        local_14b8 = local_2488;
        uStack_14b0 = uStack_2480;
        local_1448 = local_16e8;
        uStack_1440 = uStack_16e0;
        local_13d8 = local_1678;
        uStack_13d0 = uStack_1670;
        local_1368 = local_1608;
        uStack_1360 = uStack_1600;
        local_12f8 = local_1598;
        uStack_12f0 = uStack_1590;
        local_fa8 = local_fc8;
        uStack_fa0 = uStack_fc0;
        local_f38 = local_f58;
        uStack_f30 = uStack_f50;
        local_638 = local_f68;
        uStack_630 = uStack_f60;
        local_608 = local_628;
        uStack_600 = uStack_620;
        local_5c8 = local_fd8;
        uStack_5c0 = uStack_fd0;
        local_598 = local_5b8;
        uStack_590 = uStack_5b0;
        local_558 = local_f68;
        uStack_550 = uStack_f60;
        local_528 = local_548;
        uStack_520 = uStack_540;
        local_4e8 = local_fd8;
        uStack_4e0 = uStack_fd0;
        local_4b8 = local_4d8;
        uStack_4b0 = uStack_4d0;
        local_398 = local_2488;
        uStack_390 = uStack_2480;
        local_368 = local_388;
        uStack_360 = uStack_380;
        local_288 = local_2a8;
        uStack_280 = uStack_2a0;
        local_278 = local_2c28;
        uStack_270 = uStack_2c20;
        local_108 = local_1b48;
        uStack_100 = uStack_1b40;
        local_38 = local_2268;
        uStack_30 = uStack_2260;
        local_28 = local_2588;
        uStack_20 = uStack_2580;
      }
      for (; local_2db4 < local_2cd8; local_2db4 = local_2db4 + 1) {
        fVar27 = *(float *)*local_2d68;
        auVar25._0_8_ = std::exp((double)(ulong)*(uint *)*local_2d68);
        auVar25._8_8_ = extraout_XMM0_Qb;
        auVar26._4_12_ = auVar25._4_12_;
        auVar26._0_4_ = SUB84(auVar25._0_8_,0) + 1.0;
        dVar24 = std::log(auVar26._0_8_);
        dVar24 = std::tanh(dVar24);
        *(float *)*local_2d68 = fVar27 * SUB84(dVar24,0);
        local_2d68 = (undefined1 (*) [16])(*local_2d68 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}